

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_8::TwoLevelIterator::SkipEmptyDataBlocksForward(TwoLevelIterator *this)

{
  bool bVar1;
  Iterator *pIVar2;
  Iterator *in_RDI;
  TwoLevelIterator *unaff_retaddr;
  TwoLevelIterator *in_stack_00000030;
  byte local_11;
  Iterator *data_iter;
  
  data_iter = in_RDI;
  while( true ) {
    pIVar2 = IteratorWrapper::iter((IteratorWrapper *)(in_RDI + 3));
    local_11 = 1;
    if (pIVar2 != (Iterator *)0x0) {
      bVar1 = IteratorWrapper::Valid((IteratorWrapper *)(in_RDI + 3));
      local_11 = bVar1 ^ 0xff;
    }
    if ((local_11 & 1) == 0) break;
    bVar1 = IteratorWrapper::Valid((IteratorWrapper *)&in_RDI[2].cleanup_head_);
    if (!bVar1) {
      SetDataIterator(unaff_retaddr,data_iter);
      return;
    }
    IteratorWrapper::Next((IteratorWrapper *)in_RDI);
    InitDataBlock(in_stack_00000030);
    pIVar2 = IteratorWrapper::iter((IteratorWrapper *)(in_RDI + 3));
    if (pIVar2 != (Iterator *)0x0) {
      IteratorWrapper::SeekToFirst((IteratorWrapper *)in_RDI);
    }
  }
  return;
}

Assistant:

void TwoLevelIterator::SkipEmptyDataBlocksForward() {
  while (data_iter_.iter() == nullptr || !data_iter_.Valid()) {
    // Move to next block
    if (!index_iter_.Valid()) {
      SetDataIterator(nullptr);
      return;
    }
    index_iter_.Next();
    InitDataBlock();
    if (data_iter_.iter() != nullptr) data_iter_.SeekToFirst();
  }
}